

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<MyTest>::AddTestPattern
          (ParameterizedTestSuiteInfo<MyTest> *this,char *param_1,char *test_base_name,
          TestMetaFactoryBase<std::tuple<unsigned_long,_unsigned_long>_> *meta_factory,
          CodeLocation *code_location)

{
  TestInfo *this_00;
  TestInfo *local_60;
  CodeLocation local_58;
  
  this_00 = (TestInfo *)operator_new(0x50);
  CodeLocation::CodeLocation(&local_58,code_location);
  TestInfo::TestInfo(this_00,test_base_name,meta_factory,&local_58);
  local_60 = this_00;
  std::
  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<MyTest>::TestInfo>,std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<MyTest>::TestInfo>>>
  ::emplace_back<testing::internal::ParameterizedTestSuiteInfo<MyTest>::TestInfo*>
            ((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<MyTest>::TestInfo>,std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<MyTest>::TestInfo>>>
              *)&this->tests_,&local_60);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void AddTestPattern(const char*, const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory,
                      CodeLocation code_location) {
    tests_.emplace_back(
        new TestInfo(test_base_name, meta_factory, std::move(code_location)));
  }